

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

void __thiscall
nvim::Nvim::async_buf_clear_namespace
          (Nvim *this,Buffer buffer,Integer ns_id,Integer line_start,Integer line_end)

{
  string local_70;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  Buffer local_38;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50 = line_end;
  local_48 = line_start;
  local_40 = ns_id;
  local_38 = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"nvim_buf_clear_namespace","")
  ;
  NvimRPC::async_call<long,long,long,long>
            (&this->client_,&local_70,&local_38,&local_40,&local_48,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::async_buf_clear_namespace(Buffer buffer, Integer ns_id, Integer line_start, Integer line_end) {
    client_.async_call("nvim_buf_clear_namespace", buffer, ns_id, line_start, line_end);
}